

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O3

Maybe<capnp::InterfaceSchema> __thiscall
capnp::InterfaceSchema::findSuperclass(InterfaceSchema *this,uint64_t typeId)

{
  uint *in_RDX;
  Maybe<capnp::InterfaceSchema> MVar2;
  uint counter;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 aVar1;
  
  if (in_RDX == (uint *)0x3) {
    *(undefined1 *)&(this->super_Schema).raw = 1;
    this[1].super_Schema.raw = (RawBrandedSchema *)0x27f968;
    aVar1 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2)0x3;
  }
  else {
    MVar2 = findSuperclass(this,typeId,in_RDX);
    aVar1 = MVar2.ptr.field_1;
  }
  MVar2.ptr.field_1 = aVar1;
  MVar2.ptr._0_8_ = this;
  return (Maybe<capnp::InterfaceSchema>)MVar2.ptr;
}

Assistant:

kj::Maybe<InterfaceSchema> InterfaceSchema::findSuperclass(uint64_t typeId) const {
  if (typeId == _::NULL_INTERFACE_SCHEMA.id) {
    // We consider all interfaces to extend the null schema.
    return InterfaceSchema();
  }
  uint counter = 0;
  return findSuperclass(typeId, counter);
}